

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComponentManagerUtils.h
# Opt level: O1

ErrorCode __thiscall JHCOM::GetServiceHelper::operator()(GetServiceHelper *this,IID *iid,void **obj)

{
  ErrorCode EVar1;
  long *plVar2;
  
  plVar2 = (long *)JHCOM::getComponentManager();
  EVar1 = (**(code **)(*plVar2 + 0x50))(plVar2,this->mCid->mId,iid->mId,obj);
  if (this->mError != (ErrorCode *)0x0) {
    *this->mError = EVar1;
  }
  if ((EVar1 != kNoError) && (this->mFatal != false)) {
    jh_log_print(1,
                 "virtual ErrorCode JHCOM::GetServiceHelper::operator()(const IID &, void **) const"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/include/ComponentManagerUtils.h"
                 ,0x50,"Failed to CreateInstance cid %s iid %s",this->mCid->mId,iid->mId);
  }
  return EVar1;
}

Assistant:

virtual ErrorCode operator()( const IID& iid, void** obj ) const	
		{
			IComponentManager *mgr = getComponentManager();
			ErrorCode err = mgr->GetService( mCid, iid, obj );
			if ( mError != NULL )
				*mError = err;
			if ( mFatal && err != kNoError )
				LOG_ERR_FATAL( "Failed to CreateInstance cid %s iid %s", 
					mCid.toString(), iid.toString() );
			return err;
		}